

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_rawequal(lua_State *L,int idx1,int idx2)

{
  TValue *o1_00;
  TValue *o2_00;
  int in_EDX;
  int in_ESI;
  lua_State *in_RDI;
  cTValue *o2;
  cTValue *o1;
  int local_24;
  
  o1_00 = index2adr(in_RDI,in_ESI);
  o2_00 = index2adr(in_RDI,in_EDX);
  if ((o1_00 == (TValue *)((ulong)(in_RDI->glref).ptr32 + 0x68)) ||
     (o2_00 == (TValue *)((ulong)(in_RDI->glref).ptr32 + 0x68))) {
    local_24 = 0;
  }
  else {
    local_24 = lj_obj_equal(o1_00,o2_00);
  }
  return local_24;
}

Assistant:

LUA_API int lua_rawequal(lua_State *L, int idx1, int idx2)
{
  cTValue *o1 = index2adr(L, idx1);
  cTValue *o2 = index2adr(L, idx2);
  return (o1 == niltv(L) || o2 == niltv(L)) ? 0 : lj_obj_equal(o1, o2);
}